

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

void __thiscall QMakeEvaluator::setTemplate(QMakeEvaluator *this)

{
  Data *pDVar1;
  ProString *pPVar2;
  qsizetype qVar3;
  bool bVar4;
  QList<ProString> *this_00;
  iterator aend;
  iterator iVar5;
  long in_FS_OFFSET;
  ProString val;
  QStringBuilder<QString_&,_ProString_&> local_d8;
  ProString local_c8;
  QArrayDataPointer<ProString> local_98;
  undefined1 local_78 [32];
  undefined1 *local_58;
  undefined1 *puStack_50;
  QArrayDataPointer<ProString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &valuesRef(this,(ProKey *)(QMakeInternal::statics + 0x150))->super_QList<ProString>;
  if ((this->m_option->user_template).d.size == 0) {
    if ((this_00->d).size != 0) {
      iVar5 = QList<ProString>::begin(this_00);
      aend = QList<ProString>::end(this_00);
      QList<ProString>::erase(this_00,iVar5.i + 1,(const_iterator)aend.i);
      goto LAB_0027cefe;
    }
    ProString::ProString((ProString *)local_78,"app");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_78);
    QList<ProString>::end(this_00);
  }
  else {
    ProString::ProString((ProString *)local_78,&this->m_option->user_template);
    local_48.d = (Data *)0x0;
    local_48.ptr = (ProString *)0x0;
    local_48.size = 0;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)&local_48,0,(ProString *)local_78);
    QList<ProString>::end((QList<ProString> *)&local_48);
    qVar3 = local_48.size;
    pPVar2 = local_48.ptr;
    pDVar1 = local_48.d;
    local_48.d = (Data *)0x0;
    local_48.ptr = (ProString *)0x0;
    local_48.size = 0;
    local_c8.m_string.d.d = (Data *)(this_00->d).d;
    local_c8.m_string.d.ptr = (char16_t *)(this_00->d).ptr;
    (this_00->d).d = pDVar1;
    (this_00->d).ptr = pPVar2;
    local_c8.m_string.d.size = (this_00->d).size;
    (this_00->d).size = qVar3;
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_c8);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_48);
  }
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
LAB_0027cefe:
  if ((this->m_option->user_template_prefix).d.size != 0) {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    iVar5 = QList<ProString>::begin(this_00);
    ProString::ProString((ProString *)local_78,iVar5.i);
    bVar4 = ProString::startsWith
                      ((ProString *)local_78,&this->m_option->user_template_prefix,CaseSensitive);
    if (!bVar4) {
      local_d8.a = &this->m_option->user_template_prefix;
      local_d8.b = (ProString *)local_78;
      ProString::ProString<QString&,ProString&>(&local_c8,&local_d8);
      local_98.d = (Data *)0x0;
      local_98.ptr = (ProString *)0x0;
      local_98.size = 0;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_98,0,&local_c8);
      QList<ProString>::end((QList<ProString> *)&local_98);
      qVar3 = local_98.size;
      pPVar2 = local_98.ptr;
      pDVar1 = local_98.d;
      local_98.d = (Data *)0x0;
      local_98.ptr = (ProString *)0x0;
      local_98.size = 0;
      local_48.d = (this_00->d).d;
      local_48.ptr = (this_00->d).ptr;
      (this_00->d).d = pDVar1;
      (this_00->d).ptr = pPVar2;
      local_48.size = (this_00->d).size;
      (this_00->d).size = qVar3;
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_98);
      if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::setTemplate()
{
    ProStringList &values = valuesRef(statics.strTEMPLATE);
    if (!m_option->user_template.isEmpty()) {
        // Don't allow override
        values = ProStringList(ProString(m_option->user_template));
    } else {
        if (values.isEmpty())
            values.append(ProString("app"));
        else
            values.erase(values.begin() + 1, values.end());
    }
    if (!m_option->user_template_prefix.isEmpty()) {
        ProString val = values.first();
        if (!val.startsWith(m_option->user_template_prefix))
            values = ProStringList(ProString(m_option->user_template_prefix + val));
    }
}